

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventDispatcher.cpp
# Opt level: O3

int __thiscall
EventDispatcherHelper::removeEventListener
          (EventDispatcherHelper *this,IEventListener *listener,int event_id)

{
  EventListenerNode *pEVar1;
  Node *pNVar2;
  int iVar3;
  AutoLock _auto_lock_;
  AutoLock AStack_38;
  
  AutoLock::AutoLock(&AStack_38,&this->mLock,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/EventDispatcher.cpp"
                     ,0x74);
  pNVar2 = ((this->mEventList).mHead)->next;
  iVar3 = -1;
  do {
    if (pNVar2 == (this->mEventList).mTail) {
LAB_0011623d:
      AutoLock::~AutoLock(&AStack_38);
      return iVar3;
    }
    pEVar1 = pNVar2->val;
    if ((pEVar1->mEventId == event_id) && (pEVar1->mListener == listener)) {
      pEVar1->mListener = (IEventListener *)0x0;
      iVar3 = 0;
      goto LAB_0011623d;
    }
    pNVar2 = pNVar2->next;
  } while( true );
}

Assistant:

int EventDispatcherHelper::removeEventListener( IEventListener *listener, int event_id )
{
	DebugAutoLock( mLock );

	for (JetHead::list<EventListenerNode*>::iterator i = mEventList.begin();
		 i != mEventList.end(); ++i)
	{
		EventListenerNode *lnode = *i;
		
		if ( lnode->mEventId == event_id && lnode->mListener == listener )
		{
			// Update mListener 
			lnode->mListener = NULL;
			return 0;
		}
	}

	// Didn't find it
	return -1;
}